

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactor.c
# Opt level: O2

Seat * interactor_borrow_seat(Interactor *itr)

{
  _Bool _Var1;
  Seat *pSVar2;
  Seat *pSVar3;
  
  pSVar2 = (*itr->vt->get_seat)(itr);
  if (pSVar2 == (Seat *)0x0) {
    pSVar2 = (Seat *)0x0;
  }
  else {
    _Var1 = is_tempseat(pSVar2);
    if (_Var1) {
      pSVar2 = tempseat_get_real(pSVar2);
      return pSVar2;
    }
    pSVar3 = tempseat_new(pSVar2);
    (*itr->vt->set_seat)(itr,pSVar3);
  }
  return pSVar2;
}

Assistant:

Seat *interactor_borrow_seat(Interactor *itr)
{
    Seat *clientseat = interactor_get_seat(itr);
    if (!clientseat)
        return NULL;

    /* If the client has already had its Seat borrowed, then look
     * through the existing TempSeat to find the underlying one. */
    if (is_tempseat(clientseat))
        return tempseat_get_real(clientseat);

    /* Otherwise, make a new TempSeat and give that to the client. */
    Seat *tempseat = tempseat_new(clientseat);
    interactor_set_seat(itr, tempseat);
    return clientseat;
}